

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_update_inter_mode_stats
               (FRAME_CONTEXT *fc,FRAME_COUNTS *counts,PREDICTION_MODE mode,int16_t mode_context)

{
  ushort uVar1;
  ushort in_CX;
  char in_DL;
  long in_RDI;
  int16_t mode_ctx;
  
  if (in_DL == '\x10') {
    update_cdf((aom_cdf_prob *)(in_RDI + 0x1f9a + (long)(short)(in_CX & 7) * 6),'\0',2);
  }
  else {
    update_cdf((aom_cdf_prob *)(in_RDI + 0x1f9a + (long)(short)(in_CX & 7) * 6),'\x01',2);
    uVar1 = (short)in_CX >> 3 & 1;
    if (in_DL == '\x0f') {
      update_cdf((aom_cdf_prob *)(in_RDI + 0x1fbe + (long)(short)uVar1 * 6),'\0',2);
    }
    else {
      update_cdf((aom_cdf_prob *)(in_RDI + 0x1fbe + (long)(short)uVar1 * 6),'\x01',2);
      update_cdf((aom_cdf_prob *)(in_RDI + 0x1fca + (long)(short)((short)in_CX >> 4 & 0xf) * 6),
                 in_DL != '\r',2);
    }
  }
  return;
}

Assistant:

void av1_update_inter_mode_stats(FRAME_CONTEXT *fc, FRAME_COUNTS *counts,
                                 PREDICTION_MODE mode, int16_t mode_context) {
  (void)counts;

  int16_t mode_ctx = mode_context & NEWMV_CTX_MASK;
  if (mode == NEWMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->newmv_mode[mode_ctx][0];
#endif
    update_cdf(fc->newmv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->newmv_mode[mode_ctx][1];
#endif
  update_cdf(fc->newmv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> GLOBALMV_OFFSET) & GLOBALMV_CTX_MASK;
  if (mode == GLOBALMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->zeromv_mode[mode_ctx][0];
#endif
    update_cdf(fc->zeromv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->zeromv_mode[mode_ctx][1];
#endif
  update_cdf(fc->zeromv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> REFMV_OFFSET) & REFMV_CTX_MASK;
#if CONFIG_ENTROPY_STATS
  ++counts->refmv_mode[mode_ctx][mode != NEARESTMV];
#endif
  update_cdf(fc->refmv_cdf[mode_ctx], mode != NEARESTMV, 2);
}